

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_log.cpp
# Opt level: O0

void __thiscall cubeb_async_logger::~cubeb_async_logger(cubeb_async_logger *this)

{
  __pointer_type prVar1;
  atomic<ring_buffer_base<cubeb_log_message>_*> *in_RDI;
  atomic<ring_buffer_base<cubeb_log_message>_*> *this_00;
  
  this_00 = in_RDI;
  prVar1 = std::atomic<ring_buffer_base<cubeb_log_message>_*>::load
                     (in_RDI,(memory_order)((ulong)in_RDI >> 0x20));
  if ((prVar1 != (__pointer_type)0x0) &&
     (prVar1 = std::atomic<ring_buffer_base<cubeb_log_message>_*>::load
                         (this_00,(memory_order)((ulong)in_RDI >> 0x20)),
     prVar1 != (__pointer_type)0x0)) {
    ring_buffer_base<cubeb_log_message>::~ring_buffer_base
              ((ring_buffer_base<cubeb_log_message> *)0x111f85);
    operator_delete(prVar1,0x18);
  }
  std::thread::~thread((thread *)0x111fa3);
  return;
}

Assistant:

~cubeb_async_logger()
  {
    assert(logging_thread.get_id() == std::thread::id() &&
           (g_cubeb_log_callback == cubeb_noop_log_callback ||
            !g_cubeb_log_callback));
    if (msg_queue.load()) {
      delete msg_queue.load();
    }
  }